

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O0

void decode_fglrx_ioctl_68(fglrx_ioctl_68 *d,mmt_memory_dump *args,int argc)

{
  int iVar1;
  mmt_buf *local_48;
  mmt_buf *__ret_1;
  mmt_buf *data2;
  mmt_buf *local_30;
  mmt_buf *__ret;
  mmt_buf *data1;
  int argc_local;
  mmt_memory_dump *args_local;
  fglrx_ioctl_68 *d_local;
  
  local_30 = (mmt_buf *)0x0;
  if ((d->ptr1 != 0) || (iVar1 = _fglrx_field_enabled("ptr1"), iVar1 != 0)) {
    if (d->ptr1 == 0) {
      fprintf(_stdout,"%sptr1: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%sptr1: 0x%016lx",fglrx_pfx,d->ptr1);
      if (0 < argc) {
        local_30 = find_ptr(d->ptr1,args,argc);
      }
      if (local_30 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  local_48 = (mmt_buf *)0x0;
  if ((d->ptr2 != 0) || (iVar1 = _fglrx_field_enabled("ptr2"), iVar1 != 0)) {
    if (d->ptr2 == 0) {
      fprintf(_stdout,"%sptr2: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%sptr2: 0x%016lx",fglrx_pfx,d->ptr2);
      if (0 < argc) {
        local_48 = find_ptr(d->ptr2,args,argc);
      }
      if (local_48 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk10 != 0) || (iVar1 = _fglrx_field_enabled("unk10"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk10: 0x%08x",fglrx_pfx,(ulong)d->unk10);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk14 != 0) || (iVar1 = _fglrx_field_enabled("unk14"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk14: 0x%08x",fglrx_pfx,(ulong)d->unk14);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk18 != 0) || (iVar1 = _fglrx_field_enabled("unk18"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk18: 0x%08x",fglrx_pfx,(ulong)d->unk18);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk1c != 0) || (iVar1 = _fglrx_field_enabled("unk1c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk1c: 0x%08x",fglrx_pfx,(ulong)d->unk1c);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk20 != 0) || (iVar1 = _fglrx_field_enabled("unk20"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk20: 0x%08x",fglrx_pfx,(ulong)d->unk20);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk24 != 0) || (iVar1 = _fglrx_field_enabled("unk24"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk24: 0x%08x",fglrx_pfx,(ulong)d->unk24);
  }
  fglrx_pfx = fglrx_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (local_30 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(local_30,"ptr1[]:");
  }
  if (local_48 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(local_48,"ptr2[]:");
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_68(struct fglrx_ioctl_68 *d, struct mmt_memory_dump *args, int argc)
{
	struct mmt_buf *data1 = fglrx_print_ptr(d, ptr1, args, argc);
	struct mmt_buf *data2 = fglrx_print_ptr(d, ptr2, args, argc);
	fglrx_print_x32(d, unk10);
	fglrx_print_x32(d, unk14);
	fglrx_print_x32(d, unk18);
	fglrx_print_x32(d, unk1c);
	fglrx_print_x32(d, unk20);
	fglrx_print_x32(d, unk24);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_words_horiz(data1, "ptr1[]:");
	if (data2)
		dump_mmt_buf_as_words_horiz(data2, "ptr2[]:");
}